

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O0

int __thiscall
FNodeBuilder::FVertexMapSimple::SelectVertexClose(FVertexMapSimple *this,FPrivVert *vert)

{
  uint uVar1;
  int iVar2;
  FPrivVert *pFVar3;
  uint local_30;
  uint i;
  uint stop;
  FPrivVert *verts;
  FPrivVert *vert_local;
  FVertexMapSimple *this_local;
  
  pFVar3 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                     (&this->MyBuilder->Vertices,0);
  uVar1 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::Size(&this->MyBuilder->Vertices)
  ;
  local_30 = 0;
  do {
    if (uVar1 <= local_30) {
      iVar2 = InsertVertex(this,vert);
      return iVar2;
    }
    iVar2 = pFVar3[local_30].super_FSimpleVert.x - (vert->super_FSimpleVert).x;
    if (iVar2 < 1) {
      iVar2 = -iVar2;
    }
    if (iVar2 < 6) {
      iVar2 = pFVar3[local_30].super_FSimpleVert.y - (vert->super_FSimpleVert).y;
      if (iVar2 < 1) {
        iVar2 = -iVar2;
      }
      if (iVar2 < 6) {
        return local_30;
      }
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

int FNodeBuilder::FVertexMapSimple::SelectVertexClose(FNodeBuilder::FPrivVert &vert)
{
	FPrivVert *verts = &MyBuilder.Vertices[0];
	unsigned int stop = MyBuilder.Vertices.Size();

	for (unsigned int i = 0; i < stop; ++i)
	{
#if VERTEX_EPSILON <= 1
		if (verts[i].x == vert.x && verts[i].y == y)
#else
		if (abs(verts[i].x - vert.x) < VERTEX_EPSILON &&
			abs(verts[i].y - vert.y) < VERTEX_EPSILON)
#endif
		{
			return i;
		}
	}
	// Not present: add it!
	return InsertVertex (vert);
}